

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int execSql(sqlite3 *db,char **pzErrMsg,char *zSql)

{
  sqlite3_stmt *pStmt_00;
  int iVar1;
  int iVar2;
  sqlite3_stmt *in_RAX;
  uchar *zSql_00;
  char *zNew;
  sqlite3_stmt *pStmt;
  
  pStmt = in_RAX;
  iVar1 = sqlite3_prepare_v2(db,zSql,-1,&pStmt,(char **)0x0);
  pStmt_00 = pStmt;
  if (iVar1 == 0) {
LAB_0014829f:
    do {
      do {
        iVar2 = sqlite3_step(pStmt_00);
        if (iVar2 != 100) goto LAB_001482f4;
        zSql_00 = sqlite3_column_text(pStmt_00,0);
      } while (zSql_00 == (uchar *)0x0);
      if (*zSql_00 == 'I') {
        if ((zSql_00[1] != 'N') || (zSql_00[2] != 'S')) goto LAB_0014829f;
      }
      else if ((*zSql_00 != 'C') || ((zSql_00[1] != 'R' || (zSql_00[2] != 'E')))) goto LAB_0014829f;
      iVar2 = execSql(db,pzErrMsg,(char *)zSql_00);
    } while (iVar2 == 0);
LAB_001482f4:
    iVar1 = 0;
    if (iVar2 != 0x65) {
      iVar1 = iVar2;
    }
    if (iVar1 != 0) {
      zNew = sqlite3_errmsg(db);
      sqlite3SetString(pzErrMsg,db,zNew);
    }
    sqlite3_finalize(pStmt);
  }
  return iVar1;
}

Assistant:

static int execSql(sqlite3 *db, char **pzErrMsg, const char *zSql){
  sqlite3_stmt *pStmt;
  int rc;

  /* printf("SQL: [%s]\n", zSql); fflush(stdout); */
  rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
  if( rc!=SQLITE_OK ) return rc;
  while( SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
    const char *zSubSql = (const char*)sqlite3_column_text(pStmt,0);
    assert( sqlite3_strnicmp(zSql,"SELECT",6)==0 );
    /* The secondary SQL must be one of CREATE TABLE, CREATE INDEX,
    ** or INSERT.  Historically there have been attacks that first
    ** corrupt the sqlite_master.sql field with other kinds of statements
    ** then run VACUUM to get those statements to execute at inappropriate
    ** times. */
    if( zSubSql
     && (strncmp(zSubSql,"CRE",3)==0 || strncmp(zSubSql,"INS",3)==0)
    ){
      rc = execSql(db, pzErrMsg, zSubSql);
      if( rc!=SQLITE_OK ) break;
    }
  }
  assert( rc!=SQLITE_ROW );
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  if( rc ){
    sqlite3SetString(pzErrMsg, db, sqlite3_errmsg(db));
  }
  (void)sqlite3_finalize(pStmt);
  return rc;
}